

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esni.c
# Opt level: O2

int main(int argc,char **argv)

{
  ushort uVar1;
  ptls_cipher_suite_t *ppVar2;
  size_t sVar3;
  uint *__s;
  int iVar4;
  FILE *pFVar5;
  EVP_PKEY *pkey;
  size_t len;
  ulong uVar6;
  long lVar7;
  int *piVar8;
  uint *puVar9;
  ptls_cipher_suite_t **pppVar10;
  FILE *pFVar11;
  char *pcVar12;
  char *__format;
  ptls_key_exchange_context_t **ctx;
  anon_struct_2056_2_5014a043 *paVar13;
  size_t sStack_10e0;
  uint16_t padded_length;
  undefined1 local_10d6;
  undefined1 local_10d5;
  ushort local_10d4;
  ushort local_10d2;
  ptls_buffer_t local_10d0;
  ulong local_10b0;
  uint *local_10a8;
  uint64_t lifetime;
  uint local_1098;
  undefined2 local_1094;
  undefined2 local_1092;
  uint *local_1090;
  uint64_t local_1088;
  undefined4 local_107c;
  ulong local_1078;
  ulong local_1070;
  undefined4 local_1068 [10];
  ptls_cipher_suite_t *local_1040 [256];
  ulong local_840;
  anon_struct_2056_2_5014a043 key_exchanges;
  
  OPENSSL_init_crypto(2);
  OPENSSL_init_crypto(0xc);
  ENGINE_load_builtin_engines();
  ENGINE_register_all_ciphers();
  ENGINE_register_all_digests();
  memset(&key_exchanges,0,0x808);
  memset(local_1040,0,0x800);
  padded_length = 0x104;
  lifetime = 0x76a700;
  local_10b0 = 0;
  local_1090 = (uint *)0x0;
  local_10a8 = (uint *)0x0;
LAB_00105a54:
  pppVar10 = local_1040;
  iVar4 = getopt(argc,argv,"n:K:c:d:p:o:h");
  __s = local_10a8;
  puVar9 = _optarg;
  switch(iVar4) {
  case 99:
    pppVar10 = ptls_openssl_cipher_suites;
    do {
      ppVar2 = *pppVar10;
      if (ppVar2 == (ptls_cipher_suite_t *)0x0) goto LAB_00106042;
      iVar4 = strcasecmp(ppVar2->aead->name,(char *)puVar9);
      pppVar10 = pppVar10 + 1;
    } while (iVar4 != 0);
    local_1040[local_10b0] = ppVar2;
    local_10b0 = local_10b0 + 1;
    goto LAB_00105a54;
  case 100:
    iVar4 = __isoc99_sscanf(_optarg,"%lu",&lifetime);
    if ((iVar4 != 1) || (lifetime == 0)) {
      pcVar12 = "lifetime must be a positive integer\n";
      sStack_10e0 = 0x24;
      goto LAB_00105e80;
    }
    lifetime = lifetime * 0x15180;
    goto LAB_00105a54;
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
    goto switchD_00105a71_caseD_65;
  case 0x68:
    usage(*argv,0);
LAB_00106063:
    pcVar12 = "unknown type of private key found in file:%s\n";
    puVar9 = _optarg;
    goto LAB_00106077;
  case 0x6e:
    local_10a8 = _optarg;
    goto LAB_00105a54;
  case 0x6f:
    local_1090 = _optarg;
    goto LAB_00105a54;
  case 0x70:
    goto switchD_00105a71_caseD_70;
  default:
    if (iVar4 == 0x4b) {
      pFVar5 = fopen((char *)_optarg,"rt");
      pFVar11 = _stderr;
      puVar9 = _optarg;
      if (pFVar5 == (FILE *)0x0) {
        piVar8 = __errno_location();
        pcVar12 = strerror(*piVar8);
        __format = "failed to open file:%s:%s\n";
      }
      else {
        pkey = PEM_read_PrivateKey(pFVar5,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
        pFVar11 = _stderr;
        puVar9 = _optarg;
        if (pkey != (EVP_PKEY *)0x0) {
          fclose(pFVar5);
          ctx = key_exchanges.elements + key_exchanges.count;
          key_exchanges.count = key_exchanges.count + 1;
          iVar4 = ptls_openssl_create_key_exchange(ctx,(EVP_PKEY *)pkey);
          if (iVar4 != 0) goto LAB_00106063;
          EVP_PKEY_free(pkey);
          goto LAB_00105a54;
        }
        piVar8 = __errno_location();
        pcVar12 = strerror(*piVar8);
        __format = "failed to read private key from file:%s:%s\n";
      }
      fprintf(pFVar11,__format,puVar9,pcVar12);
      goto LAB_001060d2;
    }
    if (iVar4 == -1) {
      local_840 = local_10b0;
      if (local_10b0 == 0) {
        local_840 = 1;
        local_1040[0] = &ptls_openssl_aes128gcmsha256;
      }
      if (key_exchanges.count == 0) {
        pcVar12 = "no private key specified\n";
        sStack_10e0 = 0x19;
        goto LAB_00105e80;
      }
      local_1098 = (uint)padded_length;
      local_10b0 = time((time_t *)0x0);
      local_1088 = lifetime;
      local_10d0.base = "";
      local_10d0.is_allocated = 0;
      local_10d0.capacity = 0;
      local_10d0.off = 0;
      local_1092 = 0x2ff;
      iVar4 = ptls_buffer__do_pushv(&local_10d0,&local_1092,2);
      if (iVar4 != 0) goto LAB_00105e63;
      local_107c = 0;
      iVar4 = ptls_buffer__do_pushv(&local_10d0,&local_107c,4);
      if (iVar4 != 0) goto LAB_00105e63;
      if (__s == (uint *)0x0) {
        local_1094 = 0;
        iVar4 = ptls_buffer__do_pushv(&local_10d0,&local_1094,2);
        if (iVar4 != 0) goto LAB_00105e63;
      }
      else {
        iVar4 = ptls_buffer__do_pushv(&local_10d0,"",2);
        sVar3 = local_10d0.off;
        if (iVar4 != 0) goto LAB_00105e63;
        len = strlen((char *)__s);
        iVar4 = ptls_buffer__do_pushv(&local_10d0,__s,len);
        if (iVar4 != 0) goto LAB_00105e63;
        (local_10d0.base + -2)[sVar3] = (uint8_t)(local_10d0.off - sVar3 >> 8);
        (local_10d0.base + -1)[sVar3] = (uint8_t)(local_10d0.off - sVar3);
      }
      iVar4 = ptls_buffer__do_pushv(&local_10d0,"",2);
      if (iVar4 != 0) goto LAB_00105e63;
      local_10a8 = (uint *)local_10d0.off;
      paVar13 = &key_exchanges;
      break;
    }
switchD_00105a71_caseD_65:
    usage(*argv,1);
    puVar9 = &switchD_00105a71::switchdataD_00114004;
LAB_00106042:
    pcVar12 = "unknown cipher-suite: %s\n";
LAB_00106077:
    fprintf(_stderr,pcVar12,puVar9);
    goto LAB_001060d2;
  }
LAB_00105d67:
  if (paVar13->elements[0] == (ptls_key_exchange_context_t *)0x0) goto LAB_00105df5;
  uVar1 = paVar13->elements[0]->algo->id;
  local_10d2 = uVar1 << 8 | uVar1 >> 8;
  iVar4 = ptls_buffer__do_pushv(&local_10d0,&local_10d2,2);
  if (((iVar4 != 0) ||
      (iVar4 = ptls_buffer__do_pushv(&local_10d0,"",2), sVar3 = local_10d0.off, iVar4 != 0)) ||
     (iVar4 = ptls_buffer__do_pushv
                        (&local_10d0,(paVar13->elements[0]->pubkey).base,
                         (paVar13->elements[0]->pubkey).len), iVar4 != 0)) goto LAB_00105e63;
  (local_10d0.base + -2)[sVar3] = (uint8_t)(local_10d0.off - sVar3 >> 8);
  (local_10d0.base + -1)[sVar3] = (uint8_t)(local_10d0.off - sVar3);
  paVar13 = (anon_struct_2056_2_5014a043 *)(paVar13->elements + 1);
  goto LAB_00105d67;
switchD_00105a71_caseD_70:
  iVar4 = __isoc99_sscanf(_optarg,"%hu",&padded_length);
  if ((iVar4 != 1) || (padded_length == 0)) goto LAB_001060f2;
  goto LAB_00105a54;
LAB_001060f2:
  pcVar12 = "padded length must be a positive integer\n";
  sStack_10e0 = 0x29;
  goto LAB_00105e80;
LAB_00105df5:
  (local_10d0.base + -2)[(long)local_10a8] = (uint8_t)(local_10d0.off - (long)local_10a8 >> 8);
  (local_10d0.base + -1)[(long)local_10a8] = (uint8_t)(local_10d0.off - (long)local_10a8);
  iVar4 = ptls_buffer__do_pushv(&local_10d0,"",2);
  sVar3 = local_10d0.off;
  if (iVar4 == 0) {
    do {
      if (*pppVar10 == (ptls_cipher_suite_t *)0x0) {
        (local_10d0.base + -2)[sVar3] = (uint8_t)(local_10d0.off - sVar3 >> 8);
        (local_10d0.base + -1)[sVar3] = (uint8_t)(local_10d0.off - sVar3);
        local_10d6 = (undefined1)(local_1098 >> 8);
        local_10d5 = (undefined1)local_1098;
        iVar4 = ptls_buffer__do_pushv(&local_10d0,&local_10d6,2);
        if (iVar4 == 0) {
          local_1070 = local_10b0 >> 0x38 | (local_10b0 & 0xff000000000000) >> 0x28 |
                       (local_10b0 & 0xff0000000000) >> 0x18 | (local_10b0 & 0xff00000000) >> 8 |
                       (local_10b0 & 0xff000000) << 8 | (local_10b0 & 0xff0000) << 0x18 |
                       (local_10b0 & 0xff00) << 0x28 | local_10b0 << 0x38;
          iVar4 = ptls_buffer__do_pushv(&local_10d0,&local_1070,8);
          if (iVar4 == 0) {
            uVar6 = (local_10b0 + local_1088) - 1;
            local_1078 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                         (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                         (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                         (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
            iVar4 = ptls_buffer__do_pushv(&local_10d0,&local_1078,8);
            if ((iVar4 == 0) &&
               (iVar4 = ptls_buffer__do_pushv(&local_10d0,"",2), puVar9 = local_1090, iVar4 == 0)) {
              for (lVar7 = -2; lVar7 != 0; lVar7 = lVar7 + 1) {
                (local_10d0.base + local_10d0.off)[lVar7] = '\0';
              }
              ptls_calc_hash(&ptls_openssl_sha256,local_1068,local_10d0.base,local_10d0.off);
              *(undefined4 *)(local_10d0.base + 2) = local_1068[0];
              if (puVar9 == (uint *)0x0) {
                fwrite(local_10d0.base,1,local_10d0.off,_stdout);
                fflush(_stdout);
              }
              else {
                pFVar5 = fopen((char *)puVar9,"wb");
                pFVar11 = _stderr;
                puVar9 = _optarg;
                if (pFVar5 == (FILE *)0x0) {
                  piVar8 = __errno_location();
                  pcVar12 = strerror(*piVar8);
                  fprintf(pFVar11,"failed to open file:%s:%s\n",puVar9,pcVar12);
                }
                else {
                  fwrite(local_10d0.base,1,local_10d0.off,pFVar5);
                  fclose(pFVar5);
                }
              }
              ptls_buffer__release_memory(&local_10d0);
              return 0;
            }
          }
        }
        break;
      }
      uVar1 = (*pppVar10)->id;
      local_10d4 = uVar1 << 8 | uVar1 >> 8;
      iVar4 = ptls_buffer__do_pushv(&local_10d0,&local_10d4,2);
      pppVar10 = pppVar10 + 1;
    } while (iVar4 == 0);
  }
LAB_00105e63:
  ptls_buffer__release_memory(&local_10d0);
  pcVar12 = "failed to generate ESNI private structure.\n";
  sStack_10e0 = 0x2b;
LAB_00105e80:
  fwrite(pcVar12,sStack_10e0,1,_stderr);
LAB_001060d2:
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    char const *published_sni = NULL;
    char const *file_output = NULL;
    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    struct {
        ptls_key_exchange_context_t *elements[256];
        size_t count;
    } key_exchanges = {{NULL}, 0};
    struct {
        ptls_cipher_suite_t *elements[256];
        size_t count;
    } cipher_suites = {{NULL}, 0};
    uint16_t padded_length = 260;
    uint64_t lifetime = 90 * 86400;

    int ch;

    while ((ch = getopt(argc, argv, "n:K:c:d:p:o:h")) != -1) {
        switch (ch) {
        case 'n':
            published_sni = optarg;
            break;
        case 'K': {
            FILE *fp;
            EVP_PKEY *pkey;

            if ((fp = fopen(optarg, "rt")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }

            if ((pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL)) == NULL) {
                fprintf(stderr, "failed to read private key from file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }
            fclose(fp);
            if (ptls_openssl_create_key_exchange(key_exchanges.elements + key_exchanges.count++, pkey) != 0) {
                fprintf(stderr, "unknown type of private key found in file:%s\n", optarg);
                exit(1);
            }
            EVP_PKEY_free(pkey);
        } break;
        case 'c': {
            size_t i;
            for (i = 0; ptls_openssl_cipher_suites[i] != NULL; ++i)
                if (strcasecmp(ptls_openssl_cipher_suites[i]->aead->name, optarg) == 0)
                    break;
            if (ptls_openssl_cipher_suites[i] == NULL) {
                fprintf(stderr, "unknown cipher-suite: %s\n", optarg);
                exit(1);
            }
            cipher_suites.elements[cipher_suites.count++] = ptls_openssl_cipher_suites[i];
        } break;
        case 'd':
            if (sscanf(optarg, "%" SCNu64, &lifetime) != 1 || lifetime == 0) {
                fprintf(stderr, "lifetime must be a positive integer\n");
                exit(1);
            }
            lifetime *= 86400; /* convert to seconds */
            break;
        case 'p':
#ifdef _WINDOWS
            if (sscanf_s(optarg, "%" SCNu16, &padded_length) != 1 || padded_length == 0) {
                fprintf(stderr, "padded length must be a positive integer\n");
                exit(1);
            }
#else
            if (sscanf(optarg, "%" SCNu16, &padded_length) != 1 || padded_length == 0) {
                fprintf(stderr, "padded length must be a positive integer\n");
                exit(1);
            }
#endif
            break;
        case 'o':
            file_output = optarg;
            break;
        case 'h':
            usage(argv[0], 0);
            break;
        default:
            usage(argv[0], 1);
            break;
        }
    }
    if (cipher_suites.count == 0)
        cipher_suites.elements[cipher_suites.count++] = &ptls_openssl_aes128gcmsha256;
    if (key_exchanges.count == 0) {
        fprintf(stderr, "no private key specified\n");
        exit(1);
    }

    argc -= optind;
    argv += optind;

    if (emit_esni(key_exchanges.elements, cipher_suites.elements, padded_length, time(NULL), lifetime, published_sni,
                  file_output) != 0) {
        fprintf(stderr, "failed to generate ESNI private structure.\n");
        exit(1);
    }

    return 0;
}